

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerNSC::InjectConstraints
          (ChContactContainerNSC *this,ChSystemDescriptor *mdescriptor)

{
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_6_3,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_3_3,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_333_3,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_333_6,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_333_333,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_666_3,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_666_6,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_666_333,mdescriptor);
  _InjectConstraints<chrono::ChContactNSC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&this->contactlist_666_666,mdescriptor);
  _InjectConstraints<chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6_rolling,mdescriptor);
  return;
}

Assistant:

void ChContactContainerNSC::InjectConstraints(ChSystemDescriptor& mdescriptor) {
    _InjectConstraints(contactlist_6_6, mdescriptor);
    _InjectConstraints(contactlist_6_3, mdescriptor);
    _InjectConstraints(contactlist_3_3, mdescriptor);
    _InjectConstraints(contactlist_333_3, mdescriptor);
    _InjectConstraints(contactlist_333_6, mdescriptor);
    _InjectConstraints(contactlist_333_333, mdescriptor);
    _InjectConstraints(contactlist_666_3, mdescriptor);
    _InjectConstraints(contactlist_666_6, mdescriptor);
    _InjectConstraints(contactlist_666_333, mdescriptor);
    _InjectConstraints(contactlist_666_666, mdescriptor);
    _InjectConstraints(contactlist_6_6_rolling, mdescriptor);
}